

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::BranchLayerParams::_InternalSerialize
          (BranchLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  NeuralNetwork *pNVar2;
  ulong uVar3;
  void *data;
  uint8_t *puVar4;
  undefined8 *puVar5;
  size_t __n;
  
  if ((this != (BranchLayerParams *)_BranchLayerParams_default_instance_) &&
     (this->ifbranch_ != (NeuralNetwork *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pNVar2 = this->ifbranch_;
    *target = '\n';
    uVar1 = (pNVar2->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = NeuralNetwork::_InternalSerialize(pNVar2,puVar4,stream);
  }
  if ((this != (BranchLayerParams *)_BranchLayerParams_default_instance_) &&
     (this->elsebranch_ != (NeuralNetwork *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pNVar2 = this->elsebranch_;
    *target = '\x12';
    uVar1 = (pNVar2->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = NeuralNetwork::_InternalSerialize(pNVar2,puVar4,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    data = *(void **)((uVar3 & 0xfffffffffffffffc) + 8);
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 1) == 0) {
      puVar5 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar5 = (undefined8 *)((uVar3 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar5[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar5[1],target);
      return puVar4;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* BranchLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.BranchLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NeuralNetwork ifBranch = 1;
  if (this->_internal_has_ifbranch()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::ifbranch(this), target, stream);
  }

  // .CoreML.Specification.NeuralNetwork elseBranch = 2;
  if (this->_internal_has_elsebranch()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::elsebranch(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.BranchLayerParams)
  return target;
}